

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_formatter-inl.h
# Opt level: O1

int __thiscall
spdlog::json_formatter::clone
          (json_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  formatter fVar1;
  void *extraout_RDX;
  long *plVar2;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>,_bool>
  pVar3;
  populator_set populators;
  formatter local_78;
  long *local_70;
  _Hashtable<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  plVar2 = *(long **)(__fn + 0x38);
  if (plVar2 != (long *)0x0) {
    do {
      (**(code **)(*(long *)plVar2[1] + 0x18))(&local_70,(long *)plVar2[1],__child_stack);
      local_78._vptr_formatter = (_func_int **)&local_68;
      pVar3 = std::
              _Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,false>>>>
                        ((_Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_68,&local_70,&local_78);
      __child_stack = pVar3._8_8_;
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
        __child_stack = extraout_RDX;
      }
      plVar2 = (long *)*plVar2;
    } while (plVar2 != (long *)0x0);
  }
  details::
  make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>,std::__cxx11::string_const&>
            ((details *)&local_78,
             (unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
              *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 8));
  fVar1._vptr_formatter = local_78._vptr_formatter;
  local_78._vptr_formatter = (_func_int **)0x0;
  (this->super_formatter)._vptr_formatter = fVar1._vptr_formatter;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> json_formatter::clone() const
{
    populators::populator_set populators;
    for (const auto &populator : populators_)
    {
        populators.insert(populator->clone());
    }
    return details::make_unique<json_formatter>(std::move(populators), kEOL);
}